

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

UnitsPtr __thiscall libcellml::Model::units(Model *this,size_t index)

{
  undefined8 *puVar1;
  long lVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  UnitsPtr UVar3;
  
  (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
       (_func_int **)0x0;
  (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
       (EntityImpl *)0x0;
  lVar2 = *(long *)(*(long *)(index + 8) + 0x88);
  if (in_RDX._M_pi <
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      (*(long *)(*(long *)(index + 8) + 0x90) - lVar2 >> 4)) {
    puVar1 = (undefined8 *)(lVar2 + (long)in_RDX._M_pi * 0x10);
    (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
         (_func_int **)*puVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
                mPimpl,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1));
    in_RDX._M_pi = extraout_RDX;
  }
  UVar3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  UVar3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (UnitsPtr)UVar3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

UnitsPtr Model::units(size_t index) const
{
    UnitsPtr units = nullptr;
    if (index < pFunc()->mUnits.size()) {
        units = pFunc()->mUnits.at(index);
    }

    return units;
}